

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

wstring * __thiscall
sf::String::toWideString_abi_cxx11_(wstring *__return_storage_ptr__,String *this)

{
  pointer puVar1;
  size_type sVar2;
  pointer puVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  sVar2 = (this->m_string)._M_string_length;
  if (0 < (long)sVar2) {
    puVar3 = (this->m_string)._M_dataplus._M_p;
    puVar1 = puVar3 + sVar2;
    do {
      std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
      puVar3 = puVar3 + 1;
    } while (puVar3 < puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring String::toWideString() const
{
    // Prepare the output string
    std::wstring output;
    output.reserve(m_string.length() + 1);

    // Convert
    Utf32::toWide(m_string.begin(), m_string.end(), std::back_inserter(output), 0);

    return output;
}